

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Nick.cpp
# Opt level: O0

ssize_t __thiscall Enterprise::Nick::write(Nick *this,int __fd,void *__buf,size_t __n)

{
  byte source;
  uint16_t uVar1;
  uint uVar2;
  Nick *pNVar3;
  uint local_18;
  int c;
  uint8_t value_local;
  uint16_t address_local;
  Nick *this_local;
  
  source = (byte)__buf;
  uVar2 = __fd & 3;
  pNVar3 = (Nick *)(ulong)(uVar2 - 3);
  if (uVar2 < 3 || uVar2 - 3 == 0) {
    pNVar3 = (Nick *)((long)&switchD_0074d928::switchdataD_00a53ca4 +
                     (long)(int)(&switchD_0074d928::switchdataD_00a53ca4)[uVar2]);
    switch(uVar2) {
    case 0:
      local_18 = 0;
      while ((int)local_18 < 8) {
        uVar1 = anon_unknown.dwarf_aa827f::mapped_colour(source * '\b' + (char)local_18);
        this->palette_[(int)(local_18 + 8)] = uVar1;
        local_18 = local_18 + 1;
        pNVar3 = (Nick *)(ulong)local_18;
      }
      break;
    case 1:
      if (this->output_type_ == Border) {
        set_output_type(this,Border,true);
      }
      uVar1 = anon_unknown.dwarf_aa827f::mapped_colour(source);
      this->border_colour_ = uVar1;
      pNVar3 = this;
      break;
    case 2:
      this->line_parameter_base_ = this->line_parameter_base_ & 0xf000 | (ushort)source << 4;
      pNVar3 = this;
      break;
    case 3:
      this->line_parameter_base_ = this->line_parameter_base_ & 0xff0 | (ushort)source << 0xc;
      if (((source ^ this->line_parameter_control_) & source & 0x80) != 0) {
        this->lines_remaining_ = 0xff;
        this->should_reload_line_parameters_ = true;
      }
      this->line_parameter_control_ = source & 0xc0;
      pNVar3 = this;
    }
  }
  return (ssize_t)pNVar3;
}

Assistant:

void Nick::write(uint16_t address, uint8_t value) {
	switch(address & 3) {
		case 0:
			// Ignored: everything to do with external colour.
			for(int c = 0; c < 8; c++) {
				palette_[c + 8] = mapped_colour(uint8_t(((value & 0x1f) << 3) + c));
			}
		break;
		case 1:
			if(output_type_ == OutputType::Border) {
				set_output_type(OutputType::Border, true);
			}
			border_colour_ = mapped_colour(value);
		break;
		case 2:
			line_parameter_base_ = uint16_t((line_parameter_base_ & 0xf000) | (value << 4));
		break;
		case 3:
			line_parameter_base_ = uint16_t((line_parameter_base_ & 0x0ff0) | (value << 12));

			// Still a mystery to me: the exact meaning of the top two bits here. For now
			// just treat a 0 -> 1 transition of the MSB as a forced frame restart.
			if((value^line_parameter_control_) & value & 0x80) {
				// For now: just force this to be the final line of this mode block.
				// I'm unclear whether I should also reset the horizontal counter
				// (i.e. completely abandon current video phase).
				lines_remaining_ = 0xff;
				should_reload_line_parameters_ = true;
			}
			line_parameter_control_ = value & 0xc0;
		break;
	}
}